

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

int lj_lib_checkopt(lua_State *L,int narg,int def,char *lst)

{
  uint uVar1;
  int iVar2;
  GCstr *pGVar3;
  byte bVar4;
  int iVar5;
  
  if ((def < 0) ||
     ((L->base + ((ulong)(uint)narg - 1) < L->top &&
      (*(int *)((long)L->base + (ulong)(uint)narg * 8 + -4) != -1)))) {
    pGVar3 = lj_lib_checkstr(L,narg);
  }
  else {
    pGVar3 = (GCstr *)0x0;
  }
  if (pGVar3 == (GCstr *)0x0) {
    return def;
  }
  bVar4 = *lst;
  if (bVar4 != 0) {
    uVar1 = pGVar3->len;
    iVar5 = 0;
    do {
      if ((uVar1 == bVar4) && (iVar2 = bcmp(pGVar3 + 1,(byte *)lst + 1,(ulong)uVar1), iVar2 == 0)) {
        return iVar5;
      }
      lst = (char *)((byte *)lst + (ulong)bVar4 + 1);
      iVar5 = iVar5 + 1;
      bVar4 = *lst;
    } while (bVar4 != 0);
  }
  lj_err_argv(L,narg,LJ_ERR_INVOPTM,pGVar3 + 1);
}

Assistant:

int lj_lib_checkopt(lua_State *L, int narg, int def, const char *lst)
{
  GCstr *s = def >= 0 ? lj_lib_optstr(L, narg) : lj_lib_checkstr(L, narg);
  if (s) {
    const char *opt = strdata(s);
    MSize len = s->len;
    int i;
    for (i = 0; *(const uint8_t *)lst; i++) {
      if (*(const uint8_t *)lst == len && memcmp(opt, lst+1, len) == 0)
	return i;
      lst += 1+*(const uint8_t *)lst;
    }
    lj_err_argv(L, narg, LJ_ERR_INVOPTM, opt);
  }
  return def;
}